

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3336::Test_TemplateTestUtilTest_IsHiddenSection::
Test_TemplateTestUtilTest_IsHiddenSection(Test_TemplateTestUtilTest_IsHiddenSection *this)

{
  value_type local_18;
  Test_TemplateTestUtilTest_IsHiddenSection *local_10;
  Test_TemplateTestUtilTest_IsHiddenSection *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateTestUtilTest, IsHiddenSection) {
  TemplateDictionary dict("test_IsHiddenSection");

  {
    TemplateDictionaryPeer peer(&dict);
    EXPECT_TRUE(peer.IsHiddenSection("SECTION"));
  }

  dict.AddSectionDictionary("SECTION");

  {
    TemplateDictionaryPeer peer(&dict);
    EXPECT_FALSE(peer.IsHiddenSection("SECTION"));
  }
}